

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

GList * g_list_insert_sorted(GList *list,gpointer data,GCompareFunc compare)

{
  gint gVar1;
  GList *n;
  GList *i;
  GCompareFunc compare_local;
  gpointer data_local;
  GList *list_local;
  
  list_local = (GList *)g_malloc(0x18);
  list_local->data = data;
  n = list;
  if (list == (GList *)0x0) {
    list_local->prev = (GList *)0x0;
    list_local->next = (GList *)0x0;
  }
  else {
    for (; n != (GList *)0x0; n = n->next) {
      list_local->prev = n->prev;
      gVar1 = (*compare)(data,n->data);
      if (gVar1 < 1) {
        list_local->next = n;
        n->prev = list_local;
        if (n != list) {
          return list;
        }
        return list_local;
      }
    }
    list_local->prev = list_local->prev->next;
    list_local->next = (GList *)0x0;
    list_local->prev->next = list_local;
    list_local = list;
  }
  return list_local;
}

Assistant:

GList *g_list_insert_sorted(GList *list, gpointer data, GCompareFunc compare)
{
    GList *i;
    GList *n = (GList*)g_malloc(sizeof(GList));
    n->data = data;
    if (list == NULL) {
        n->next = n->prev = NULL;
        return n;
    }
    for (i = list; i; i = i->next) {
        n->prev = i->prev;
        if ((*compare)(data, i->data) <= 0) {
            n->next = i;
            i->prev = n;
            if (i == list) return n;
            else return list;
        }
    }
    n->prev = n->prev->next;
    n->next = NULL;
    n->prev->next = n;
    return list;
}